

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
HBF::heuristic_nhh_euclidean
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<int,_std::allocator<int>_> *goal)

{
  pointer pvVar1;
  pointer pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  allocator_type local_52;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data >> 2,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555,&local_48
           ,&local_52);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((grid->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (grid->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      pvVar1 = (grid->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data + 8) !=
          (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar7 = 0;
        do {
          piVar3 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = (int)uVar8 - piVar3[1];
          iVar4 = -iVar5;
          if (0 < iVar5) {
            iVar4 = iVar5;
          }
          iVar6 = (int)uVar7 - *piVar3;
          iVar5 = -iVar6;
          if (0 < iVar6) {
            iVar5 = iVar6;
          }
          dVar9 = (double)iVar5 * (double)iVar5 + (double)iVar4 * (double)iVar4;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          *(double *)
           (*(long *)&(__return_storage_ptr__->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar8].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar7 * 8) = dVar9;
          uVar7 = uVar7 + 1;
          pvVar1 = (grid->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)*(pointer *)
                                        ((long)&(pvVar1->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data >> 2));
      }
      uVar8 = uVar8 + 1;
      uVar7 = ((long)(grid->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(grid->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > HBF::heuristic_nhh_euclidean(vector<vector<int> > grid, vector<int> goal){
    /*
    Create the heuristic function for non-holonomic heuristic, which does not consider obstacles.
    A simple implementation that doesn't consider different trajectories at different points in cell.
    */

    vector<vector<double> > heuristic(grid.size(), vector<double>(grid[0].size(), 0));

    // give obstacles a very large value
    for (int i = 0; i < grid.size(); i ++){
        for (int j = 0; j < grid[0].size(); j ++){
            heuristic[i][j] = sqrt(pow(abs(i-goal[1]),2)+pow(abs(j-goal[0]),2));
        }
    }

    return heuristic;

}